

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,FunctionResultCallNode *node)

{
  bool bVar1;
  ExpressionNode *pEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  mapped_type *__rhs_00;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *this_00;
  element_type *peVar3;
  long *in_RSI;
  undefined8 in_RDI;
  shared_ptr<ExpressionNode> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__range1
  ;
  TypeChecker typeChecker;
  Node *in_stack_00000118;
  string *in_stack_00000120;
  SymbolTable *in_stack_ffffffffffffff18;
  TypeChecker *in_stack_ffffffffffffff20;
  __optional_ne_t<TypeName,_TypeName> local_b1;
  char *in_stack_ffffffffffffff68;
  _Self local_90;
  _Self local_88;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *local_80
  ;
  undefined4 local_38;
  TypeChecker local_28;
  long *local_10;
  
  local_10 = in_RSI;
  pEVar2 = FunctionResultCallNode::getCall((FunctionResultCallNode *)0x14bac1);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,in_RDI);
  TypeChecker::TypeChecker(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          FunctionResultCallNode::getCall((FunctionResultCallNode *)0x14baf5);
  (**(code **)(*(long *)__rhs + 0x10))(__rhs,&local_28);
  TypeChecker::getType(&local_28);
  bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x14bb32);
  local_b1 = false;
  if (bVar1) {
    TypeChecker::getType(&local_28);
    local_38 = 1;
    local_b1 = std::operator!=((optional<TypeName> *)in_stack_ffffffffffffff20,
                               (TypeName *)in_stack_ffffffffffffff18);
  }
  if (local_b1 != false) {
    TypeChecker::getType(&local_28);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::optional<TypeName>::value((optional<TypeName> *)in_stack_ffffffffffffff20);
    __rhs_00 = std::
               unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_ffffffffffffff20,(key_type *)in_stack_ffffffffffffff18);
    std::operator+(in_stack_ffffffffffffff68,__rhs);
    std::operator+(__lhs,(char *)__rhs_00);
    reportError(in_stack_00000120,in_stack_00000118);
  }
  this_00 = (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
             *)(**(code **)(*local_10 + 0x18))();
  local_80 = this_00;
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
       begin(this_00);
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::end
                 (this_00);
  while (bVar1 = std::operator!=(&local_88,&local_90), bVar1) {
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
              ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)in_stack_ffffffffffffff20);
    peVar3 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14bce1);
    (*(peVar3->super_Node)._vptr_Node[2])(peVar3,in_RDI);
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_88);
  }
  TypeChecker::~TypeChecker((TypeChecker *)0x14bd0f);
  return;
}

Assistant:

void SemanticAnalyser::visit(const FunctionResultCallNode& node) 
{
  node.getCall().accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getCall().accept(typeChecker);
  if(typeChecker.getType().has_value() && typeChecker.getType() != TypeName::Function)
    reportError("Cannot call result of function returning " + 
      TypeNameStrings.at(typeChecker.getType().value()) + "!", node);
  
  for(const auto& arg : node.getArguments())
    arg->accept(*this);
}